

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QBitArray *array)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff68;
  char in_stack_ffffffffffffff6f;
  QBitArray *in_stack_ffffffffffffff70;
  QDebug *in_stack_ffffffffffffff78;
  QDebug *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  QDebugStateSaver *in_stack_ffffffffffffff90;
  QDebug *pQVar4;
  QDebug *in_stack_ffffffffffffff98;
  QDebug *local_40;
  char *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDebugStateSaver::QDebugStateSaver
            (in_stack_ffffffffffffff90,
             (QDebug *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_stack_ffffffffffffff98,in_stack_ffffffffffffffc8);
  local_40 = (QDebug *)0x0;
  while (pQVar4 = local_40, qVar3 = QBitArray::size(in_stack_ffffffffffffff70), (long)pQVar4 < qVar3
        ) {
    bVar2 = QBitArray::testBit(in_stack_ffffffffffffff70,
                               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    if (bVar2) {
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
    }
    else {
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
    }
    local_40 = (QDebug *)((long)&local_40->stream + 1);
    if (((long)local_40 % 4 == 0) &&
       (in_stack_ffffffffffffff78 = local_40,
       in_stack_ffffffffffffff80 = (QDebug *)QBitArray::size(in_stack_ffffffffffffff70),
       (long)in_stack_ffffffffffffff78 < (long)in_stack_ffffffffffffff80)) {
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
    }
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  QDebug::QDebug(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug dbg, const QBitArray &array)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QBitArray(";
    for (qsizetype i = 0; i < array.size();) {
        if (array.testBit(i))
            dbg << '1';
        else
            dbg << '0';
        i += 1;
        if (!(i % 4) && (i < array.size()))
            dbg << ' ';
    }
    dbg << ')';
    return dbg;
}